

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t driver::zetMetricQueryPoolDestroy(zet_metric_query_pool_handle_t hMetricQueryPool)

{
  zet_pfnMetricQueryPoolDestroy_t pfnDestroy;
  ze_result_t result;
  zet_metric_query_pool_handle_t hMetricQueryPool_local;
  
  pfnDestroy._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c908 != (code *)0x0) {
    pfnDestroy._4_4_ = (*DAT_0011c908)(hMetricQueryPool);
  }
  return pfnDestroy._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricQueryPoolDestroy(
        zet_metric_query_pool_handle_t hMetricQueryPool ///< [in][release] handle of the metric query pool
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroy = context.zetDdiTable.MetricQueryPool.pfnDestroy;
        if( nullptr != pfnDestroy )
        {
            result = pfnDestroy( hMetricQueryPool );
        }
        else
        {
            // generic implementation

        }

        return result;
    }